

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O2

int cfg_validate_netaddr
              (autobuf *out,char *section_name,char *entry_name,char *value,_Bool prefix,
              int8_t *af_types,size_t af_types_count)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  char *fmt;
  netaddr addr;
  
  iVar3 = netaddr_from_string(&addr,value);
  if (iVar3 == 0) {
    bVar2 = netaddr_get_af_maxprefix((uint)addr._type);
    if (bVar2 < addr._prefix_len) {
      fmt = "Value \'%s\' for entry \'%s\' in section %s has an illegal prefix length";
    }
    else if (addr._prefix_len == bVar2 || prefix) {
      sVar4 = 0;
      fmt = "Value \'%s\' for entry \'%s\' in section \'%s\' is wrong address type";
      while (af_types_count != sVar4) {
        pcVar1 = af_types + sVar4;
        sVar4 = sVar4 + 1;
        if ((int)*pcVar1 == (uint)addr._type) {
          return 0;
        }
      }
    }
    else {
      fmt = "Value \'%s\' for entry \'%s\' in section %s must be a single address, not a prefix";
    }
  }
  else {
    fmt = "Value \'%s\' for entry \'%s\' in section %s is no valid network address";
  }
  cfg_append_printable_line(out,fmt,value,entry_name,section_name);
  return -1;
}

Assistant:

int
cfg_validate_netaddr(struct autobuf *out, const char *section_name, const char *entry_name, const char *value,
  bool prefix, const int8_t *af_types, size_t af_types_count) {
  struct netaddr addr;
  uint8_t max_prefix;
  size_t i;

  if (netaddr_from_string(&addr, value)) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s is no valid network address",
      value, entry_name, section_name);
    return -1;
  }

  max_prefix = netaddr_get_maxprefix(&addr);

  /* check prefix length */
  if (netaddr_get_prefix_length(&addr) > max_prefix) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s has an illegal prefix length",
      value, entry_name, section_name);
    return -1;
  }
  if (!prefix && netaddr_get_prefix_length(&addr) != max_prefix) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s must be a single address, not a prefix",
      value, entry_name, section_name);
    return -1;
  }

  for (i = 0; i < af_types_count; i++) {
    if (af_types[i] == netaddr_get_address_family(&addr)) {
      return 0;
    }
  }

  /* at least one condition was set, but no one matched */
  cfg_append_printable_line(out,
    "Value '%s' for entry '%s'"
    " in section '%s' is wrong address type",
    value, entry_name, section_name);
  return -1;
}